

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

vector<CLI::App_*,_std::allocator<CLI::App_*>_> * __thiscall
CLI::App::get_subcommands
          (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__return_storage_ptr__,App *this,
          bool parsed)

{
  pointer puVar1;
  pointer puVar2;
  undefined7 in_register_00000011;
  pointer ppAVar3;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *subcomms;
  allocator_type local_11;
  
  if ((int)CONCAT71(in_register_00000011,parsed) == 0) {
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
              (__return_storage_ptr__,
               (long)(this->subcommands_).
                     super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->subcommands_).
                     super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_11);
    puVar1 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppAVar3 = (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (puVar2 = (this->subcommands_).
                  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1)
    {
      *ppAVar3 = (puVar2->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t
                 .super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                 super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      ppAVar3 = ppAVar3 + 1;
    }
  }
  else {
    std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
              (__return_storage_ptr__,&this->parsed_subcommands_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<App *> get_subcommands(bool parsed = true) const {
        if(parsed) {
            return parsed_subcommands_;
        } else {
            std::vector<App *> subcomms(subcommands_.size());
            std::transform(std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) {
                return v.get();
            });
            return subcomms;
        }
    }